

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptions
          (DescriptorBuilder *this,FileDescriptorProto *proto,FileDescriptor *descriptor,
          FlatAllocator *alloc)

{
  Span<const_int> options_path_00;
  string_view option_name;
  OptionsType *pOVar1;
  string_view name_scope;
  string_view element_name;
  vector<int,_std::allocator<int>_> options_path;
  vector<int,_std::allocator<int>_> local_d8;
  string local_c0;
  undefined8 local_a0;
  char *pcStack_98;
  pointer local_90;
  size_type sStack_88;
  size_type local_80;
  AlphaNum *local_78;
  AlphaNum local_50;
  
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80 = CONCAT44(local_80._4_4_,8);
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_d8,(iterator)0x0,(int *)&local_80);
  local_78 = (AlphaNum *)(descriptor->package_->_M_dataplus)._M_p;
  local_80 = descriptor->package_->_M_string_length;
  local_50.piece_._M_len = 6;
  local_50.piece_._M_str = ".dummy";
  absl::lts_20250127::StrCat_abi_cxx11_(&local_c0,(lts_20250127 *)&local_80,&local_50,local_78);
  sStack_88 = (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  local_90 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_a0 = 0x1b;
  pcStack_98 = "google.protobuf.FileOptions";
  options_path_00.len_ = sStack_88;
  options_path_00.ptr_ =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  option_name._M_str = "google.protobuf.FileOptions";
  option_name._M_len = 0x1b;
  name_scope._M_str = local_c0._M_dataplus._M_p;
  name_scope._M_len = local_c0._M_string_length;
  element_name._M_str = (descriptor->name_->_M_dataplus)._M_p;
  element_name._M_len = descriptor->name_->_M_string_length;
  pOVar1 = AllocateOptionsImpl<google::protobuf::FileDescriptor>
                     (this,name_scope,element_name,proto,options_path_00,option_name,alloc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  descriptor->options_ = pOVar1;
  descriptor->proto_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  descriptor->merged_features_ = (FeatureSet *)_FeatureSet_default_instance_;
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptions(const FileDescriptorProto& proto,
                                        FileDescriptor* descriptor,
                                        internal::FlatAllocator& alloc) {
  std::vector<int> options_path;
  options_path.push_back(FileDescriptorProto::kOptionsFieldNumber);
  // We add the dummy token so that LookupSymbol does the right thing.
  auto options = AllocateOptionsImpl<FileDescriptor>(
      absl::StrCat(descriptor->package(), ".dummy"), descriptor->name(), proto,
      options_path, "google.protobuf.FileOptions", alloc);
  descriptor->options_ = options;
  descriptor->proto_features_ = &FeatureSet::default_instance();
  descriptor->merged_features_ = &FeatureSet::default_instance();
}